

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase629::run(TestCase629 *this)

{
  Builder value;
  Builder value_00;
  Builder value_01;
  Builder value_02;
  Builder value_03;
  Builder value_04;
  Builder value_05;
  Builder value_06;
  char *pcVar1;
  size_t sVar2;
  Branch *pBVar3;
  Builder *params;
  Builder *extraout_RDX;
  Builder *extraout_RDX_00;
  Builder *params_00;
  Builder *extraout_RDX_01;
  Builder *extraout_RDX_02;
  Builder *params_01;
  Builder *extraout_RDX_03;
  Builder *extraout_RDX_04;
  Builder *extraout_RDX_05;
  Builder *extraout_RDX_06;
  Builder *extraout_RDX_07;
  Builder *extraout_RDX_08;
  Builder *extraout_RDX_09;
  Builder *extraout_RDX_10;
  Builder *extraout_RDX_11;
  Builder *extraout_RDX_12;
  Builder *pBVar4;
  Builder *extraout_RDX_13;
  Builder *extraout_RDX_14;
  Builder *extraout_RDX_15;
  Reader value_07;
  Reader value_08;
  DebugComparison<const_char_(&)[24],_kj::String> _kjCondition;
  Builder root;
  MallocMessageBuilder builder;
  undefined8 uVar5;
  char *pcVar6;
  SegmentBuilder *pSVar7;
  String *pSVar8;
  undefined2 *puVar9;
  undefined8 uVar10;
  String local_368;
  StringTree local_348;
  undefined8 in_stack_fffffffffffffcf0;
  SegmentBuilder *pSVar11;
  CapTableBuilder *pCVar12;
  CapTableBuilder *pCVar13;
  WirePointer *pWVar14;
  WirePointer *pWVar15;
  ArrayDisposer *in_stack_fffffffffffffd10;
  char *in_stack_fffffffffffffd18;
  bool local_2d8;
  char *local_2d0;
  StructBuilder local_2c8;
  undefined8 local_2a0;
  SegmentBuilder *pSStack_298;
  CapTableBuilder *pCStack_290;
  undefined2 *puStack_288;
  WirePointer *pWStack_280;
  StructDataBitCount local_278;
  StructPointerCount SStack_274;
  undefined2 uStack_272;
  undefined8 local_270;
  SegmentBuilder *pSStack_268;
  CapTableBuilder *pCStack_260;
  undefined2 *puStack_258;
  WirePointer *pWStack_250;
  StructDataBitCount local_248;
  StructPointerCount SStack_244;
  undefined2 uStack_242;
  undefined8 local_240;
  SegmentBuilder *pSStack_238;
  CapTableBuilder *pCStack_230;
  undefined2 *puStack_228;
  WirePointer *pWStack_220;
  StructDataBitCount local_218;
  StructPointerCount SStack_214;
  undefined2 uStack_212;
  undefined8 local_210;
  SegmentBuilder *pSStack_208;
  CapTableBuilder *pCStack_200;
  undefined2 *puStack_1f8;
  WirePointer *pWStack_1f0;
  StructDataBitCount local_1e8;
  StructPointerCount SStack_1e4;
  undefined2 uStack_1e2;
  undefined8 local_1e0;
  SegmentBuilder *pSStack_1d8;
  CapTableBuilder *pCStack_1d0;
  undefined2 *puStack_1c8;
  WirePointer *pWStack_1c0;
  StructDataBitCount local_1b8;
  StructPointerCount SStack_1b4;
  undefined2 uStack_1b2;
  undefined8 local_1b0;
  SegmentBuilder *pSStack_1a8;
  CapTableBuilder *pCStack_1a0;
  undefined2 *puStack_198;
  WirePointer *pWStack_190;
  StructDataBitCount local_188;
  StructPointerCount SStack_184;
  undefined2 uStack_182;
  undefined8 local_180;
  SegmentBuilder *pSStack_178;
  CapTableBuilder *pCStack_170;
  undefined2 *puStack_168;
  WirePointer *pWStack_160;
  StructDataBitCount local_158;
  StructPointerCount SStack_154;
  undefined2 uStack_152;
  undefined8 local_150;
  SegmentBuilder *pSStack_148;
  CapTableBuilder *pCStack_140;
  undefined2 *puStack_138;
  WirePointer *pWStack_130;
  StructDataBitCount local_128;
  StructPointerCount SStack_124;
  undefined2 uStack_122;
  MallocMessageBuilder local_120;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_120,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_348,&local_120.super_MessageBuilder);
  pSVar11 = (SegmentBuilder *)local_348.size_;
  pCVar13 = (CapTableBuilder *)local_348.text.content.ptr;
  pWVar15 = (WirePointer *)local_348.text.content.size_;
  PointerBuilder::initStruct
            (&local_2c8,(PointerBuilder *)&stack0xfffffffffffffcf8,(StructSize)0x20002);
  *(undefined2 *)((long)local_2c8.data + 4) = 1;
  *(undefined4 *)((long)local_2c8.data + 8) = 0x7b;
  local_368.content.ptr = "(middle = 0, bar = 123)";
  kj::str<capnproto_test::capnp::test::TestUnnamedUnion::Builder&>
            ((String *)&local_348,(kj *)&local_2c8,params);
  kj::_::DebugExpression<char_const(&)[24]>::operator==
            ((DebugComparison<const_char_(&)[24],_kj::String> *)&stack0xfffffffffffffcf8,
             (DebugExpression<char_const(&)[24]> *)&local_368,(String *)&local_348);
  pcVar1 = local_348.text.content.ptr;
  sVar2 = local_348.size_;
  pBVar4 = extraout_RDX;
  if ((SegmentBuilder *)local_348.size_ != (SegmentBuilder *)0x0) {
    local_348.size_ = 0;
    local_348.text.content.ptr = (char *)0x0;
    (**(code **)*(WirePointer *)local_348.text.content.size_)
              (local_348.text.content.size_,sVar2,1,pcVar1,pcVar1,0);
    pBVar4 = extraout_RDX_00;
  }
  if ((local_2d8 == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::str<capnproto_test::capnp::test::TestUnnamedUnion::Builder&>
              ((String *)&local_348,(kj *)&local_2c8,pBVar4);
    kj::_::Debug::
    log<char_const(&)[64],kj::_::DebugComparison<char_const(&)[24],kj::String>&,char_const(&)[24],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x27b,ERROR,
               "\"failed: expected \" \"(\\\"(middle = 0, bar = 123)\\\") == (kj::str(root))\", _kjCondition, \"(middle = 0, bar = 123)\", kj::str(root)"
               ,(char (*) [64])"failed: expected (\"(middle = 0, bar = 123)\") == (kj::str(root))",
               (DebugComparison<const_char_(&)[24],_kj::String> *)&stack0xfffffffffffffcf8,
               (char (*) [24])"(middle = 0, bar = 123)",(String *)&local_348);
    pcVar1 = local_348.text.content.ptr;
    sVar2 = local_348.size_;
    if ((SegmentBuilder *)local_348.size_ != (SegmentBuilder *)0x0) {
      local_348.size_ = 0;
      local_348.text.content.ptr = (char *)0x0;
      (**(code **)*(WirePointer *)local_348.text.content.size_)
                (local_348.text.content.size_,sVar2,1,pcVar1,pcVar1,0);
    }
  }
  pCVar12 = pCVar13;
  pWVar14 = pWVar15;
  if (pCVar13 != (CapTableBuilder *)0x0) {
    pCVar12 = (CapTableBuilder *)0x0;
    pWVar14 = (WirePointer *)0x0;
    (**in_stack_fffffffffffffd10->_vptr_ArrayDisposer)
              (in_stack_fffffffffffffd10,pCVar13,1,pWVar15,pWVar15,0);
  }
  local_2d0 = "(middle = 0, bar = 123)";
  pSStack_148 = local_2c8.segment;
  pCStack_140 = local_2c8.capTable;
  puStack_138 = (undefined2 *)local_2c8.data;
  pWStack_130 = local_2c8.pointers;
  local_128 = local_2c8.dataSize;
  SStack_124 = local_2c8.pointerCount;
  uStack_122 = local_2c8._38_2_;
  local_150 = 0x6bf6b8;
  uVar5 = 0x6bf6b8;
  value.builder.segment = pSVar11;
  value.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffffcf0;
  value.builder.capTable = pCVar12;
  value.builder.data = pWVar14;
  value.builder.pointers = (WirePointer *)in_stack_fffffffffffffd10;
  value.builder._32_8_ = in_stack_fffffffffffffd18;
  pSVar7 = local_2c8.segment;
  pCVar13 = local_2c8.capTable;
  puVar9 = (undefined2 *)local_2c8.data;
  pWVar15 = local_2c8.pointers;
  uVar10 = local_2c8._32_8_;
  prettyPrint(value);
  kj::StringTree::flatten(&local_368,&local_348);
  kj::_::DebugExpression<char_const(&)[24]>::operator==
            ((DebugComparison<const_char_(&)[24],_kj::String> *)&stack0xfffffffffffffcf8,
             (DebugExpression<char_const(&)[24]> *)&local_2d0,&local_368);
  sVar2 = local_368.content.size_;
  pcVar1 = local_368.content.ptr;
  if (local_368.content.ptr != (char *)0x0) {
    local_368.content.ptr = (char *)0x0;
    local_368.content.size_ = 0;
    (**(local_368.content.disposer)->_vptr_ArrayDisposer)
              (local_368.content.disposer,pcVar1,1,sVar2,sVar2,0,uVar5,pSVar7,pCVar13,puVar9,pWVar15
               ,uVar10);
  }
  sVar2 = local_348.branches.size_;
  pBVar3 = local_348.branches.ptr;
  if (local_348.branches.ptr != (Branch *)0x0) {
    local_348.branches.ptr = (Branch *)0x0;
    local_348.branches.size_ = 0;
    (**(local_348.branches.disposer)->_vptr_ArrayDisposer)
              (local_348.branches.disposer,pBVar3,0x40,sVar2,sVar2,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  sVar2 = local_348.text.content.size_;
  pcVar1 = local_348.text.content.ptr;
  if ((CapTableBuilder *)local_348.text.content.ptr != (CapTableBuilder *)0x0) {
    local_348.text.content.ptr = (char *)0x0;
    local_348.text.content.size_ = 0;
    (**(local_348.text.content.disposer)->_vptr_ArrayDisposer)
              (local_348.text.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  if ((local_2d8 == false) && (kj::_::Debug::minSeverity < 3)) {
    pSStack_178 = local_2c8.segment;
    pCStack_170 = local_2c8.capTable;
    puStack_168 = (undefined2 *)local_2c8.data;
    pWStack_160 = local_2c8.pointers;
    local_158 = local_2c8.dataSize;
    SStack_154 = local_2c8.pointerCount;
    uStack_152 = local_2c8._38_2_;
    local_180 = 0x6bf6b8;
    value_00.builder.segment = pSVar11;
    value_00.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffffcf0;
    value_00.builder.capTable = pCVar12;
    value_00.builder.data = pWVar14;
    value_00.builder.pointers = (WirePointer *)in_stack_fffffffffffffd10;
    value_00.builder._32_8_ = in_stack_fffffffffffffd18;
    pCVar13 = local_2c8.capTable;
    puVar9 = (undefined2 *)local_2c8.data;
    pWVar15 = local_2c8.pointers;
    uVar10 = local_2c8._32_8_;
    prettyPrint(value_00);
    pSVar8 = &local_368;
    kj::StringTree::flatten(pSVar8,&local_348);
    pcVar6 = "(middle = 0, bar = 123)";
    kj::_::Debug::
    log<char_const(&)[78],kj::_::DebugComparison<char_const(&)[24],kj::String>&,char_const(&)[24],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x27c,ERROR,
               "\"failed: expected \" \"(\\\"(middle = 0, bar = 123)\\\") == (prettyPrint(root).flatten())\", _kjCondition, \"(middle = 0, bar = 123)\", prettyPrint(root).flatten()"
               ,(char (*) [78])
                "failed: expected (\"(middle = 0, bar = 123)\") == (prettyPrint(root).flatten())",
               (DebugComparison<const_char_(&)[24],_kj::String> *)&stack0xfffffffffffffcf8,
               (char (*) [24])"(middle = 0, bar = 123)",pSVar8);
    sVar2 = local_368.content.size_;
    pcVar1 = local_368.content.ptr;
    if (local_368.content.ptr != (char *)0x0) {
      local_368.content.ptr = (char *)0x0;
      local_368.content.size_ = 0;
      (**(local_368.content.disposer)->_vptr_ArrayDisposer)
                (local_368.content.disposer,pcVar1,1,sVar2,sVar2,0,pcVar6,pSVar8,pCVar13,puVar9,
                 pWVar15,uVar10);
    }
    sVar2 = local_348.branches.size_;
    pBVar3 = local_348.branches.ptr;
    if (local_348.branches.ptr != (Branch *)0x0) {
      local_348.branches.ptr = (Branch *)0x0;
      local_348.branches.size_ = 0;
      (**(local_348.branches.disposer)->_vptr_ArrayDisposer)
                (local_348.branches.disposer,pBVar3,0x40,sVar2,sVar2,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
    }
    sVar2 = local_348.text.content.size_;
    pcVar1 = local_348.text.content.ptr;
    if ((CapTableBuilder *)local_348.text.content.ptr != (CapTableBuilder *)0x0) {
      local_348.text.content.ptr = (char *)0x0;
      local_348.text.content.size_ = 0;
      (**(local_348.text.content.disposer)->_vptr_ArrayDisposer)
                (local_348.text.content.disposer,pcVar1,1,sVar2,sVar2,0);
    }
  }
  if (pCVar12 != (CapTableBuilder *)0x0) {
    (**in_stack_fffffffffffffd10->_vptr_ArrayDisposer)
              (in_stack_fffffffffffffd10,pCVar12,1,pWVar14,pWVar14,0);
  }
  pWVar15 = local_2c8.pointers + 1;
  value_07.super_StringPtr.content.size_ = 0x22;
  value_07.super_StringPtr.content.ptr = "foooooooooooooooooooooooooooooooo";
  pSVar11 = local_2c8.segment;
  pCVar13 = local_2c8.capTable;
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&stack0xfffffffffffffcf8,value_07);
  local_368.content.ptr = "(middle = 0, bar = 123, after = \"foooooooooooooooooooooooooooooooo\")";
  kj::str<capnproto_test::capnp::test::TestUnnamedUnion::Builder&>
            ((String *)&local_348,(kj *)&local_2c8,params_00);
  kj::_::DebugExpression<char_const(&)[69]>::operator==
            ((DebugComparison<const_char_(&)[69],_kj::String> *)&stack0xfffffffffffffcf8,
             (DebugExpression<char_const(&)[69]> *)&local_368,(String *)&local_348);
  pcVar1 = local_348.text.content.ptr;
  sVar2 = local_348.size_;
  pBVar4 = extraout_RDX_01;
  if ((SegmentBuilder *)local_348.size_ != (SegmentBuilder *)0x0) {
    local_348.size_ = 0;
    local_348.text.content.ptr = (char *)0x0;
    (**(code **)*(WirePointer *)local_348.text.content.size_)
              (local_348.text.content.size_,sVar2,1,pcVar1,pcVar1,0);
    pBVar4 = extraout_RDX_02;
  }
  if ((local_2d8 == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::str<capnproto_test::capnp::test::TestUnnamedUnion::Builder&>
              ((String *)&local_348,(kj *)&local_2c8,pBVar4);
    kj::_::Debug::
    log<char_const(&)[111],kj::_::DebugComparison<char_const(&)[69],kj::String>&,char_const(&)[69],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x281,ERROR,
               "\"failed: expected \" \"(\\\"(middle = 0, bar = 123, after = \\\\\\\"foooooooooooooooooooooooooooooooo\\\\\\\")\\\") == (kj::str(root))\", _kjCondition, \"(middle = 0, bar = 123, after = \\\"foooooooooooooooooooooooooooooooo\\\")\", kj::str(root)"
               ,(char (*) [111])
                "failed: expected (\"(middle = 0, bar = 123, after = \\\"foooooooooooooooooooooooooooooooo\\\")\") == (kj::str(root))"
               ,(DebugComparison<const_char_(&)[69],_kj::String> *)&stack0xfffffffffffffcf8,
               (char (*) [69])
               "(middle = 0, bar = 123, after = \"foooooooooooooooooooooooooooooooo\")",
               (String *)&local_348);
    pcVar1 = local_348.text.content.ptr;
    sVar2 = local_348.size_;
    if ((SegmentBuilder *)local_348.size_ != (SegmentBuilder *)0x0) {
      local_348.size_ = 0;
      local_348.text.content.ptr = (char *)0x0;
      (**(code **)*(WirePointer *)local_348.text.content.size_)
                (local_348.text.content.size_,sVar2,1,pcVar1,pcVar1,0);
    }
  }
  pCVar12 = pCVar13;
  pWVar14 = pWVar15;
  if (pCVar13 != (CapTableBuilder *)0x0) {
    pCVar12 = (CapTableBuilder *)0x0;
    pWVar14 = (WirePointer *)0x0;
    (**in_stack_fffffffffffffd10->_vptr_ArrayDisposer)
              (in_stack_fffffffffffffd10,pCVar13,1,pWVar15,pWVar15,0);
  }
  local_2d0 = "( middle = 0,\n  bar = 123,\n  after = \"foooooooooooooooooooooooooooooooo\" )";
  pSStack_1a8 = local_2c8.segment;
  pCStack_1a0 = local_2c8.capTable;
  puStack_198 = (undefined2 *)local_2c8.data;
  pWStack_190 = local_2c8.pointers;
  local_188 = local_2c8.dataSize;
  SStack_184 = local_2c8.pointerCount;
  uStack_182 = local_2c8._38_2_;
  local_1b0 = 0x6bf6b8;
  uVar5 = 0x6bf6b8;
  value_01.builder.segment = pSVar11;
  value_01.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffffcf0;
  value_01.builder.capTable = pCVar12;
  value_01.builder.data = pWVar14;
  value_01.builder.pointers = (WirePointer *)in_stack_fffffffffffffd10;
  value_01.builder._32_8_ = in_stack_fffffffffffffd18;
  pSVar7 = local_2c8.segment;
  pCVar13 = local_2c8.capTable;
  puVar9 = (undefined2 *)local_2c8.data;
  pWVar15 = local_2c8.pointers;
  uVar10 = local_2c8._32_8_;
  prettyPrint(value_01);
  kj::StringTree::flatten(&local_368,&local_348);
  kj::_::DebugExpression<char_const(&)[75]>::operator==
            ((DebugComparison<const_char_(&)[75],_kj::String> *)&stack0xfffffffffffffcf8,
             (DebugExpression<char_const(&)[75]> *)&local_2d0,&local_368);
  sVar2 = local_368.content.size_;
  pcVar1 = local_368.content.ptr;
  if (local_368.content.ptr != (char *)0x0) {
    local_368.content.ptr = (char *)0x0;
    local_368.content.size_ = 0;
    (**(local_368.content.disposer)->_vptr_ArrayDisposer)
              (local_368.content.disposer,pcVar1,1,sVar2,sVar2,0,uVar5,pSVar7,pCVar13,puVar9,pWVar15
               ,uVar10);
  }
  sVar2 = local_348.branches.size_;
  pBVar3 = local_348.branches.ptr;
  if (local_348.branches.ptr != (Branch *)0x0) {
    local_348.branches.ptr = (Branch *)0x0;
    local_348.branches.size_ = 0;
    (**(local_348.branches.disposer)->_vptr_ArrayDisposer)
              (local_348.branches.disposer,pBVar3,0x40,sVar2,sVar2,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  sVar2 = local_348.text.content.size_;
  pcVar1 = local_348.text.content.ptr;
  if ((CapTableBuilder *)local_348.text.content.ptr != (CapTableBuilder *)0x0) {
    local_348.text.content.ptr = (char *)0x0;
    local_348.text.content.size_ = 0;
    (**(local_348.text.content.disposer)->_vptr_ArrayDisposer)
              (local_348.text.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  if ((local_2d8 == false) && (kj::_::Debug::minSeverity < 3)) {
    pSStack_1d8 = local_2c8.segment;
    pCStack_1d0 = local_2c8.capTable;
    puStack_1c8 = (undefined2 *)local_2c8.data;
    pWStack_1c0 = local_2c8.pointers;
    local_1b8 = local_2c8.dataSize;
    SStack_1b4 = local_2c8.pointerCount;
    uStack_1b2 = local_2c8._38_2_;
    local_1e0 = 0x6bf6b8;
    value_02.builder.segment = pSVar11;
    value_02.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffffcf0;
    value_02.builder.capTable = pCVar12;
    value_02.builder.data = pWVar14;
    value_02.builder.pointers = (WirePointer *)in_stack_fffffffffffffd10;
    value_02.builder._32_8_ = in_stack_fffffffffffffd18;
    pCVar13 = local_2c8.capTable;
    puVar9 = (undefined2 *)local_2c8.data;
    pWVar15 = local_2c8.pointers;
    uVar10 = local_2c8._32_8_;
    prettyPrint(value_02);
    pSVar8 = &local_368;
    kj::StringTree::flatten(pSVar8,&local_348);
    pcVar6 = "( middle = 0,\n  bar = 123,\n  after = \"foooooooooooooooooooooooooooooooo\" )";
    kj::_::Debug::
    log<char_const(&)[139],kj::_::DebugComparison<char_const(&)[75],kj::String>&,char_const(&)[75],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x286,ERROR,
               "\"failed: expected \" \"(\\\"( middle = 0,\\\\n\\\" \\\"  bar = 123,\\\\n\\\" \\\"  after = \\\\\\\"foooooooooooooooooooooooooooooooo\\\\\\\" )\\\") == (prettyPrint(root).flatten())\", _kjCondition, \"( middle = 0,\\n\" \"  bar = 123,\\n\" \"  after = \\\"foooooooooooooooooooooooooooooooo\\\" )\", prettyPrint(root).flatten()"
               ,(char (*) [139])
                "failed: expected (\"( middle = 0,\\n\" \"  bar = 123,\\n\" \"  after = \\\"foooooooooooooooooooooooooooooooo\\\" )\") == (prettyPrint(root).flatten())"
               ,(DebugComparison<const_char_(&)[75],_kj::String> *)&stack0xfffffffffffffcf8,
               (char (*) [75])
               "( middle = 0,\n  bar = 123,\n  after = \"foooooooooooooooooooooooooooooooo\" )",
               pSVar8);
    sVar2 = local_368.content.size_;
    pcVar1 = local_368.content.ptr;
    if (local_368.content.ptr != (char *)0x0) {
      local_368.content.ptr = (char *)0x0;
      local_368.content.size_ = 0;
      (**(local_368.content.disposer)->_vptr_ArrayDisposer)
                (local_368.content.disposer,pcVar1,1,sVar2,sVar2,0,pcVar6,pSVar8,pCVar13,puVar9,
                 pWVar15,uVar10);
    }
    sVar2 = local_348.branches.size_;
    pBVar3 = local_348.branches.ptr;
    if (local_348.branches.ptr != (Branch *)0x0) {
      local_348.branches.ptr = (Branch *)0x0;
      local_348.branches.size_ = 0;
      (**(local_348.branches.disposer)->_vptr_ArrayDisposer)
                (local_348.branches.disposer,pBVar3,0x40,sVar2,sVar2,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
    }
    sVar2 = local_348.text.content.size_;
    pcVar1 = local_348.text.content.ptr;
    if ((CapTableBuilder *)local_348.text.content.ptr != (CapTableBuilder *)0x0) {
      local_348.text.content.ptr = (char *)0x0;
      local_348.text.content.size_ = 0;
      (**(local_348.text.content.disposer)->_vptr_ArrayDisposer)
                (local_348.text.content.disposer,pcVar1,1,sVar2,sVar2,0);
    }
  }
  if (pCVar12 != (CapTableBuilder *)0x0) {
    (**in_stack_fffffffffffffd10->_vptr_ArrayDisposer)
              (in_stack_fffffffffffffd10,pCVar12,1,pWVar14,pWVar14,0);
  }
  value_08.super_StringPtr.content.size_ = 7;
  value_08.super_StringPtr.content.ptr = "before";
  pSVar11 = local_2c8.segment;
  pCVar13 = local_2c8.capTable;
  pWVar15 = local_2c8.pointers;
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&stack0xfffffffffffffcf8,value_08);
  local_368.content.ptr =
       "(before = \"before\", middle = 0, bar = 123, after = \"foooooooooooooooooooooooooooooooo\")"
  ;
  kj::str<capnproto_test::capnp::test::TestUnnamedUnion::Builder&>
            ((String *)&local_348,(kj *)&local_2c8,params_01);
  kj::_::DebugExpression<char_const(&)[88]>::operator==
            ((DebugComparison<const_char_(&)[88],_kj::String> *)&stack0xfffffffffffffcf8,
             (DebugExpression<char_const(&)[88]> *)&local_368,(String *)&local_348);
  pcVar1 = local_348.text.content.ptr;
  sVar2 = local_348.size_;
  pBVar4 = extraout_RDX_03;
  if ((SegmentBuilder *)local_348.size_ != (SegmentBuilder *)0x0) {
    local_348.size_ = 0;
    local_348.text.content.ptr = (char *)0x0;
    (**(code **)*(WirePointer *)local_348.text.content.size_)
              (local_348.text.content.size_,sVar2,1,pcVar1,pcVar1,0);
    pBVar4 = extraout_RDX_04;
  }
  if ((local_2d8 == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::str<capnproto_test::capnp::test::TestUnnamedUnion::Builder&>
              ((String *)&local_348,(kj *)&local_2c8,pBVar4);
    kj::_::Debug::
    log<char_const(&)[135],kj::_::DebugComparison<char_const(&)[88],kj::String>&,char_const(&)[88],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x28b,ERROR,
               "\"failed: expected \" \"(\\\"(before = \\\\\\\"before\\\\\\\", middle = 0, bar = 123, \\\" \\\"after = \\\\\\\"foooooooooooooooooooooooooooooooo\\\\\\\")\\\") == (kj::str(root))\", _kjCondition, \"(before = \\\"before\\\", middle = 0, bar = 123, \" \"after = \\\"foooooooooooooooooooooooooooooooo\\\")\", kj::str(root)"
               ,(char (*) [135])
                "failed: expected (\"(before = \\\"before\\\", middle = 0, bar = 123, \" \"after = \\\"foooooooooooooooooooooooooooooooo\\\")\") == (kj::str(root))"
               ,(DebugComparison<const_char_(&)[88],_kj::String> *)&stack0xfffffffffffffcf8,
               (char (*) [88])
               "(before = \"before\", middle = 0, bar = 123, after = \"foooooooooooooooooooooooooooooooo\")"
               ,(String *)&local_348);
    pcVar1 = local_348.text.content.ptr;
    sVar2 = local_348.size_;
    if ((SegmentBuilder *)local_348.size_ != (SegmentBuilder *)0x0) {
      local_348.size_ = 0;
      local_348.text.content.ptr = (char *)0x0;
      (**(code **)*(WirePointer *)local_348.text.content.size_)
                (local_348.text.content.size_,sVar2,1,pcVar1,pcVar1,0);
    }
  }
  pCVar12 = pCVar13;
  pWVar14 = pWVar15;
  if (pCVar13 != (CapTableBuilder *)0x0) {
    pCVar12 = (CapTableBuilder *)0x0;
    pWVar14 = (WirePointer *)0x0;
    (**in_stack_fffffffffffffd10->_vptr_ArrayDisposer)
              (in_stack_fffffffffffffd10,pCVar13,1,pWVar15,pWVar15,0);
  }
  local_2d0 = 
  "( before = \"before\",\n  middle = 0,\n  bar = 123,\n  after = \"foooooooooooooooooooooooooooooooo\" )"
  ;
  pSStack_208 = local_2c8.segment;
  pCStack_200 = local_2c8.capTable;
  puStack_1f8 = (undefined2 *)local_2c8.data;
  pWStack_1f0 = local_2c8.pointers;
  local_1e8 = local_2c8.dataSize;
  SStack_1e4 = local_2c8.pointerCount;
  uStack_1e2 = local_2c8._38_2_;
  local_210 = 0x6bf6b8;
  uVar5 = 0x6bf6b8;
  value_03.builder.segment = pSVar11;
  value_03.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffffcf0;
  value_03.builder.capTable = pCVar12;
  value_03.builder.data = pWVar14;
  value_03.builder.pointers = (WirePointer *)in_stack_fffffffffffffd10;
  value_03.builder._32_8_ = in_stack_fffffffffffffd18;
  pSVar7 = local_2c8.segment;
  pCVar13 = local_2c8.capTable;
  puVar9 = (undefined2 *)local_2c8.data;
  pWVar15 = local_2c8.pointers;
  uVar10 = local_2c8._32_8_;
  prettyPrint(value_03);
  kj::StringTree::flatten(&local_368,&local_348);
  kj::_::DebugExpression<char_const(&)[96]>::operator==
            ((DebugComparison<const_char_(&)[96],_kj::String> *)&stack0xfffffffffffffcf8,
             (DebugExpression<char_const(&)[96]> *)&local_2d0,&local_368);
  sVar2 = local_368.content.size_;
  pcVar1 = local_368.content.ptr;
  pBVar4 = extraout_RDX_05;
  if (local_368.content.ptr != (char *)0x0) {
    local_368.content.ptr = (char *)0x0;
    local_368.content.size_ = 0;
    (**(local_368.content.disposer)->_vptr_ArrayDisposer)
              (local_368.content.disposer,pcVar1,1,sVar2,sVar2,0,uVar5,pSVar7,pCVar13,puVar9,pWVar15
               ,uVar10);
    pBVar4 = extraout_RDX_06;
  }
  sVar2 = local_348.branches.size_;
  pBVar3 = local_348.branches.ptr;
  if (local_348.branches.ptr != (Branch *)0x0) {
    local_348.branches.ptr = (Branch *)0x0;
    local_348.branches.size_ = 0;
    (**(local_348.branches.disposer)->_vptr_ArrayDisposer)
              (local_348.branches.disposer,pBVar3,0x40,sVar2,sVar2,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
    pBVar4 = extraout_RDX_07;
  }
  sVar2 = local_348.text.content.size_;
  pcVar1 = local_348.text.content.ptr;
  if ((CapTableBuilder *)local_348.text.content.ptr != (CapTableBuilder *)0x0) {
    local_348.text.content.ptr = (char *)0x0;
    local_348.text.content.size_ = 0;
    (**(local_348.text.content.disposer)->_vptr_ArrayDisposer)
              (local_348.text.content.disposer,pcVar1,1,sVar2,sVar2,0);
    pBVar4 = extraout_RDX_08;
  }
  if ((local_2d8 == false) && (kj::_::Debug::minSeverity < 3)) {
    pSStack_238 = local_2c8.segment;
    pCStack_230 = local_2c8.capTable;
    puStack_228 = (undefined2 *)local_2c8.data;
    pWStack_220 = local_2c8.pointers;
    local_218 = local_2c8.dataSize;
    SStack_214 = local_2c8.pointerCount;
    uStack_212 = local_2c8._38_2_;
    local_240 = 0x6bf6b8;
    value_04.builder.segment = pSVar11;
    value_04.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffffcf0;
    value_04.builder.capTable = pCVar12;
    value_04.builder.data = pWVar14;
    value_04.builder.pointers = (WirePointer *)in_stack_fffffffffffffd10;
    value_04.builder._32_8_ = in_stack_fffffffffffffd18;
    pCVar13 = local_2c8.capTable;
    puVar9 = (undefined2 *)local_2c8.data;
    pWVar15 = local_2c8.pointers;
    uVar10 = local_2c8._32_8_;
    prettyPrint(value_04);
    pSVar8 = &local_368;
    kj::StringTree::flatten(pSVar8,&local_348);
    pcVar6 = 
    "( before = \"before\",\n  middle = 0,\n  bar = 123,\n  after = \"foooooooooooooooooooooooooooooooo\" )"
    ;
    kj::_::Debug::
    log<char_const(&)[166],kj::_::DebugComparison<char_const(&)[96],kj::String>&,char_const(&)[96],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x291,ERROR,
               "\"failed: expected \" \"(\\\"( before = \\\\\\\"before\\\\\\\",\\\\n\\\" \\\"  middle = 0,\\\\n\\\" \\\"  bar = 123,\\\\n\\\" \\\"  after = \\\\\\\"foooooooooooooooooooooooooooooooo\\\\\\\" )\\\") == (prettyPrint(root).flatten())\", _kjCondition, \"( before = \\\"before\\\",\\n\" \"  middle = 0,\\n\" \"  bar = 123,\\n\" \"  after = \\\"foooooooooooooooooooooooooooooooo\\\" )\", prettyPrint(root).flatten()"
               ,(char (*) [166])
                "failed: expected (\"( before = \\\"before\\\",\\n\" \"  middle = 0,\\n\" \"  bar = 123,\\n\" \"  after = \\\"foooooooooooooooooooooooooooooooo\\\" )\") == (prettyPrint(root).flatten())"
               ,(DebugComparison<const_char_(&)[96],_kj::String> *)&stack0xfffffffffffffcf8,
               (char (*) [96])
               "( before = \"before\",\n  middle = 0,\n  bar = 123,\n  after = \"foooooooooooooooooooooooooooooooo\" )"
               ,pSVar8);
    sVar2 = local_368.content.size_;
    pcVar1 = local_368.content.ptr;
    pBVar4 = extraout_RDX_09;
    if (local_368.content.ptr != (char *)0x0) {
      local_368.content.ptr = (char *)0x0;
      local_368.content.size_ = 0;
      (**(local_368.content.disposer)->_vptr_ArrayDisposer)
                (local_368.content.disposer,pcVar1,1,sVar2,sVar2,0,pcVar6,pSVar8,pCVar13,puVar9,
                 pWVar15,uVar10);
      pBVar4 = extraout_RDX_10;
    }
    sVar2 = local_348.branches.size_;
    pBVar3 = local_348.branches.ptr;
    if (local_348.branches.ptr != (Branch *)0x0) {
      local_348.branches.ptr = (Branch *)0x0;
      local_348.branches.size_ = 0;
      (**(local_348.branches.disposer)->_vptr_ArrayDisposer)
                (local_348.branches.disposer,pBVar3,0x40,sVar2,sVar2,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
      pBVar4 = extraout_RDX_11;
    }
    sVar2 = local_348.text.content.size_;
    pcVar1 = local_348.text.content.ptr;
    if ((CapTableBuilder *)local_348.text.content.ptr != (CapTableBuilder *)0x0) {
      local_348.text.content.ptr = (char *)0x0;
      local_348.text.content.size_ = 0;
      (**(local_348.text.content.disposer)->_vptr_ArrayDisposer)
                (local_348.text.content.disposer,pcVar1,1,sVar2,sVar2,0);
      pBVar4 = extraout_RDX_12;
    }
  }
  pCVar13 = pCVar12;
  pWVar15 = pWVar14;
  if (pCVar12 != (CapTableBuilder *)0x0) {
    pCVar13 = (CapTableBuilder *)0x0;
    pWVar15 = (WirePointer *)0x0;
    (**in_stack_fffffffffffffd10->_vptr_ArrayDisposer)
              (in_stack_fffffffffffffd10,pCVar12,1,pWVar14,pWVar14,0);
    pBVar4 = extraout_RDX_13;
  }
  *(undefined2 *)((long)local_2c8.data + 4) = 0;
  *(undefined2 *)local_2c8.data = 0;
  local_368.content.ptr =
       "(before = \"before\", foo = 0, middle = 0, after = \"foooooooooooooooooooooooooooooooo\")";
  kj::str<capnproto_test::capnp::test::TestUnnamedUnion::Builder&>
            ((String *)&local_348,(kj *)&local_2c8,pBVar4);
  kj::_::DebugExpression<char_const(&)[86]>::operator==
            ((DebugComparison<const_char_(&)[86],_kj::String> *)&stack0xfffffffffffffcf8,
             (DebugExpression<char_const(&)[86]> *)&local_368,(String *)&local_348);
  pcVar1 = local_348.text.content.ptr;
  sVar2 = local_348.size_;
  pBVar4 = extraout_RDX_14;
  if ((SegmentBuilder *)local_348.size_ != (SegmentBuilder *)0x0) {
    local_348.size_ = 0;
    local_348.text.content.ptr = (char *)0x0;
    (**(code **)*(WirePointer *)local_348.text.content.size_)
              (local_348.text.content.size_,sVar2,1,pcVar1,pcVar1,0);
    pBVar4 = extraout_RDX_15;
  }
  if ((local_2d8 == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::str<capnproto_test::capnp::test::TestUnnamedUnion::Builder&>
              ((String *)&local_348,(kj *)&local_2c8,pBVar4);
    kj::_::Debug::
    log<char_const(&)[130],kj::_::DebugComparison<char_const(&)[86],kj::String>&,char_const(&)[86],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x297,ERROR,
               "\"failed: expected \" \"(\\\"(before = \\\\\\\"before\\\\\\\", foo = 0, middle = 0, after = \\\\\\\"foooooooooooooooooooooooooooooooo\\\\\\\")\\\") == (kj::str(root))\", _kjCondition, \"(before = \\\"before\\\", foo = 0, middle = 0, after = \\\"foooooooooooooooooooooooooooooooo\\\")\", kj::str(root)"
               ,(char (*) [130])
                "failed: expected (\"(before = \\\"before\\\", foo = 0, middle = 0, after = \\\"foooooooooooooooooooooooooooooooo\\\")\") == (kj::str(root))"
               ,(DebugComparison<const_char_(&)[86],_kj::String> *)&stack0xfffffffffffffcf8,
               (char (*) [86])
               "(before = \"before\", foo = 0, middle = 0, after = \"foooooooooooooooooooooooooooooooo\")"
               ,(String *)&local_348);
    pcVar1 = local_348.text.content.ptr;
    sVar2 = local_348.size_;
    if ((SegmentBuilder *)local_348.size_ != (SegmentBuilder *)0x0) {
      local_348.size_ = 0;
      local_348.text.content.ptr = (char *)0x0;
      (**(code **)*(WirePointer *)local_348.text.content.size_)
                (local_348.text.content.size_,sVar2,1,pcVar1,pcVar1,0);
    }
  }
  pCVar12 = pCVar13;
  pWVar14 = pWVar15;
  if (pCVar13 != (CapTableBuilder *)0x0) {
    pCVar12 = (CapTableBuilder *)0x0;
    pWVar14 = (WirePointer *)0x0;
    (**in_stack_fffffffffffffd10->_vptr_ArrayDisposer)
              (in_stack_fffffffffffffd10,pCVar13,1,pWVar15,pWVar15,0);
  }
  local_2d0 = 
  "( before = \"before\",\n  foo = 0,\n  middle = 0,\n  after = \"foooooooooooooooooooooooooooooooo\" )"
  ;
  pSStack_268 = local_2c8.segment;
  pCStack_260 = local_2c8.capTable;
  puStack_258 = (undefined2 *)local_2c8.data;
  pWStack_250 = local_2c8.pointers;
  local_248 = local_2c8.dataSize;
  SStack_244 = local_2c8.pointerCount;
  uStack_242 = local_2c8._38_2_;
  local_270 = 0x6bf6b8;
  uVar5 = 0x6bf6b8;
  value_05.builder.segment = pSVar11;
  value_05.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffffcf0;
  value_05.builder.capTable = pCVar12;
  value_05.builder.data = pWVar14;
  value_05.builder.pointers = (WirePointer *)in_stack_fffffffffffffd10;
  value_05.builder._32_8_ = in_stack_fffffffffffffd18;
  pSVar7 = local_2c8.segment;
  pCVar13 = local_2c8.capTable;
  puVar9 = (undefined2 *)local_2c8.data;
  pWVar15 = local_2c8.pointers;
  uVar10 = local_2c8._32_8_;
  prettyPrint(value_05);
  kj::StringTree::flatten(&local_368,&local_348);
  kj::_::DebugExpression<char_const(&)[94]>::operator==
            ((DebugComparison<const_char_(&)[94],_kj::String> *)&stack0xfffffffffffffcf8,
             (DebugExpression<char_const(&)[94]> *)&local_2d0,&local_368);
  sVar2 = local_368.content.size_;
  pcVar1 = local_368.content.ptr;
  if (local_368.content.ptr != (char *)0x0) {
    local_368.content.ptr = (char *)0x0;
    local_368.content.size_ = 0;
    (**(local_368.content.disposer)->_vptr_ArrayDisposer)
              (local_368.content.disposer,pcVar1,1,sVar2,sVar2,0,uVar5,pSVar7,pCVar13,puVar9,pWVar15
               ,uVar10);
  }
  sVar2 = local_348.branches.size_;
  pBVar3 = local_348.branches.ptr;
  if (local_348.branches.ptr != (Branch *)0x0) {
    local_348.branches.ptr = (Branch *)0x0;
    local_348.branches.size_ = 0;
    (**(local_348.branches.disposer)->_vptr_ArrayDisposer)
              (local_348.branches.disposer,pBVar3,0x40,sVar2,sVar2,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  sVar2 = local_348.text.content.size_;
  pcVar1 = local_348.text.content.ptr;
  if ((CapTableBuilder *)local_348.text.content.ptr != (CapTableBuilder *)0x0) {
    local_348.text.content.ptr = (char *)0x0;
    local_348.text.content.size_ = 0;
    (**(local_348.text.content.disposer)->_vptr_ArrayDisposer)
              (local_348.text.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  if ((local_2d8 == false) && (kj::_::Debug::minSeverity < 3)) {
    pSStack_298 = local_2c8.segment;
    pCStack_290 = local_2c8.capTable;
    puStack_288 = (undefined2 *)local_2c8.data;
    pWStack_280 = local_2c8.pointers;
    local_278 = local_2c8.dataSize;
    SStack_274 = local_2c8.pointerCount;
    uStack_272 = local_2c8._38_2_;
    local_2a0 = 0x6bf6b8;
    value_06.builder.segment = pSVar11;
    value_06.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffffcf0;
    value_06.builder.capTable = pCVar12;
    value_06.builder.data = pWVar14;
    value_06.builder.pointers = (WirePointer *)in_stack_fffffffffffffd10;
    value_06.builder._32_8_ = in_stack_fffffffffffffd18;
    prettyPrint(value_06);
    pSVar8 = &local_368;
    kj::StringTree::flatten(pSVar8,&local_348);
    pcVar6 = 
    "( before = \"before\",\n  foo = 0,\n  middle = 0,\n  after = \"foooooooooooooooooooooooooooooooo\" )"
    ;
    kj::_::Debug::
    log<char_const(&)[164],kj::_::DebugComparison<char_const(&)[94],kj::String>&,char_const(&)[94],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x29d,ERROR,
               "\"failed: expected \" \"(\\\"( before = \\\\\\\"before\\\\\\\",\\\\n\\\" \\\"  foo = 0,\\\\n\\\" \\\"  middle = 0,\\\\n\\\" \\\"  after = \\\\\\\"foooooooooooooooooooooooooooooooo\\\\\\\" )\\\") == (prettyPrint(root).flatten())\", _kjCondition, \"( before = \\\"before\\\",\\n\" \"  foo = 0,\\n\" \"  middle = 0,\\n\" \"  after = \\\"foooooooooooooooooooooooooooooooo\\\" )\", prettyPrint(root).flatten()"
               ,(char (*) [164])
                "failed: expected (\"( before = \\\"before\\\",\\n\" \"  foo = 0,\\n\" \"  middle = 0,\\n\" \"  after = \\\"foooooooooooooooooooooooooooooooo\\\" )\") == (prettyPrint(root).flatten())"
               ,(DebugComparison<const_char_(&)[94],_kj::String> *)&stack0xfffffffffffffcf8,
               (char (*) [94])
               "( before = \"before\",\n  foo = 0,\n  middle = 0,\n  after = \"foooooooooooooooooooooooooooooooo\" )"
               ,pSVar8);
    sVar2 = local_368.content.size_;
    pcVar1 = local_368.content.ptr;
    if (local_368.content.ptr != (char *)0x0) {
      local_368.content.ptr = (char *)0x0;
      local_368.content.size_ = 0;
      (**(local_368.content.disposer)->_vptr_ArrayDisposer)
                (local_368.content.disposer,pcVar1,1,sVar2,sVar2,0,pcVar6,pSVar8,local_2c8.capTable,
                 local_2c8.data,local_2c8.pointers,local_2c8._32_8_);
    }
    sVar2 = local_348.branches.size_;
    pBVar3 = local_348.branches.ptr;
    if (local_348.branches.ptr != (Branch *)0x0) {
      local_348.branches.ptr = (Branch *)0x0;
      local_348.branches.size_ = 0;
      (**(local_348.branches.disposer)->_vptr_ArrayDisposer)
                (local_348.branches.disposer,pBVar3,0x40,sVar2,sVar2,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
    }
    sVar2 = local_348.text.content.size_;
    pcVar1 = local_348.text.content.ptr;
    if ((CapTableBuilder *)local_348.text.content.ptr != (CapTableBuilder *)0x0) {
      local_348.text.content.ptr = (char *)0x0;
      local_348.text.content.size_ = 0;
      (**(local_348.text.content.disposer)->_vptr_ArrayDisposer)
                (local_348.text.content.disposer,pcVar1,1,sVar2,sVar2,0);
    }
  }
  if (pCVar12 != (CapTableBuilder *)0x0) {
    (**in_stack_fffffffffffffd10->_vptr_ArrayDisposer)
              (in_stack_fffffffffffffd10,pCVar12,1,pWVar14,pWVar14,0);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_120);
  return;
}

Assistant:

TEST(Stringify, UnnamedUnions) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<test::TestUnnamedUnion>();

  root.setBar(123);

  EXPECT_EQ("(middle = 0, bar = 123)", kj::str(root));
  EXPECT_EQ("(middle = 0, bar = 123)", prettyPrint(root).flatten());

  root.setAfter("foooooooooooooooooooooooooooooooo");

  EXPECT_EQ("(middle = 0, bar = 123, after = \"foooooooooooooooooooooooooooooooo\")",
            kj::str(root));
  EXPECT_EQ(
      "( middle = 0,\n"
      "  bar = 123,\n"
      "  after = \"foooooooooooooooooooooooooooooooo\" )",
      prettyPrint(root).flatten());

  root.setBefore("before");

  EXPECT_EQ("(before = \"before\", middle = 0, bar = 123, "
      "after = \"foooooooooooooooooooooooooooooooo\")", kj::str(root));
  EXPECT_EQ(
      "( before = \"before\",\n"
      "  middle = 0,\n"
      "  bar = 123,\n"
      "  after = \"foooooooooooooooooooooooooooooooo\" )",
      prettyPrint(root).flatten());

  root.setFoo(0);

  EXPECT_EQ(
      "(before = \"before\", foo = 0, middle = 0, after = \"foooooooooooooooooooooooooooooooo\")",
      kj::str(root));
  EXPECT_EQ(
      "( before = \"before\",\n"
      "  foo = 0,\n"
      "  middle = 0,\n"
      "  after = \"foooooooooooooooooooooooooooooooo\" )",
      prettyPrint(root).flatten());
}